

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int aead_decrypt_1rtt(void *ctx,uint64_t pn,quicly_decoded_packet_t *packet,size_t aead_off,
                     size_t *ptlen)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  undefined8 *in_RDX;
  long in_RDI;
  size_t *in_R8;
  ptls_aead_context_t *aead;
  ptls_cipher_suite_t *cipher;
  int ret;
  size_t aead_index;
  st_quicly_application_space_t *space;
  quicly_conn_t *conn;
  size_t in_stack_ffffffffffffff98;
  quicly_decoded_packet_t *packet_00;
  quicly_conn_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_RDI + 0x540);
  uVar3 = (ulong)(int)(uint)((*(byte *)*in_RDX & 4) != 0);
  if (*(long *)(lVar1 + 0x58 + uVar3 * 8) != 0) goto LAB_0013dae6;
  while( true ) {
    if (*(long *)(*(long *)(in_RDI + 0x540) + 0x48) != 0) {
      ptls_cipher_free((ptls_cipher_context_t *)0x13da58);
      *(undefined8 *)(*(long *)(in_RDI + 0x540) + 0x48) = 0;
    }
    in_stack_ffffffffffffffa8 = (quicly_conn_t *)ptls_get_cipher(*(ptls_t **)(in_RDI + 0x8b0));
    iVar2 = update_1rtt_key((quicly_conn_t *)pn,(ptls_cipher_suite_t *)packet,aead_off._4_4_,
                            (ptls_aead_context_t **)ptlen,(uint8_t *)conn);
    if (iVar2 != 0) break;
    *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0xa8) + 1;
    in_stack_ffffffffffffffb4 = 0;
LAB_0013dae6:
    packet_00 = *(quicly_decoded_packet_t **)(lVar1 + 0x58 + uVar3 * 8);
    sVar4 = aead_decrypt_core((ptls_aead_context_t *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (uint64_t)in_stack_ffffffffffffffa8,packet_00,
                              in_stack_ffffffffffffff98);
    *in_R8 = sVar4;
    if (sVar4 != 0xffffffffffffffff) {
      if (((*(long *)(lVar1 + 0xa8) != *(long *)(lVar1 + 0xb0)) &&
          ((*(ulong *)(lVar1 + 0xa8) & 1) == uVar3)) &&
         (iVar2 = received_key_update(in_stack_ffffffffffffffa8,(uint64_t)packet_00), iVar2 != 0)) {
        return iVar2;
      }
      return 0;
    }
    if ((*(long *)(lVar1 + 0xb0) != *(long *)(lVar1 + 0xa8)) ||
       ((*(ulong *)(lVar1 + 0xb0) & 1) == uVar3)) {
      return 0xff01;
    }
    aead_decrypt_core((ptls_aead_context_t *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (uint64_t)in_stack_ffffffffffffffa8,packet_00,in_stack_ffffffffffffff98);
  }
  return iVar2;
}

Assistant:

static int aead_decrypt_1rtt(void *ctx, uint64_t pn, quicly_decoded_packet_t *packet, size_t aead_off, size_t *ptlen)
{
    quicly_conn_t *conn = ctx;
    struct st_quicly_application_space_t *space = conn->application;
    size_t aead_index = (packet->octets.base[0] & QUICLY_KEY_PHASE_BIT) != 0;
    int ret;

    /* prepare key, when not available (yet) */
    if (space->cipher.ingress.aead[aead_index] == NULL) {
    Retry_1RTT : {
        /* Replace the AEAD key at the alternative slot (note: decryption key slots are shared by 0-RTT and 1-RTT), at the same time
         * dropping 0-RTT header protection key. */
        if (conn->application->cipher.ingress.header_protection.zero_rtt != NULL) {
            ptls_cipher_free(conn->application->cipher.ingress.header_protection.zero_rtt);
            conn->application->cipher.ingress.header_protection.zero_rtt = NULL;
        }
        ptls_cipher_suite_t *cipher = ptls_get_cipher(conn->crypto.tls);
        if ((ret = update_1rtt_key(conn, cipher, 0, &space->cipher.ingress.aead[aead_index], space->cipher.ingress.secret)) != 0)
            return ret;
        ++space->cipher.ingress.key_phase.prepared;
        QUICLY_PROBE(CRYPTO_RECEIVE_KEY_UPDATE_PREPARE, conn, conn->stash.now, space->cipher.ingress.key_phase.prepared,
                     QUICLY_PROBE_HEXDUMP(space->cipher.ingress.secret, cipher->hash->digest_size));
    }
    }

    /* decrypt */
    ptls_aead_context_t *aead = space->cipher.ingress.aead[aead_index];
    if ((*ptlen = aead_decrypt_core(aead, pn, packet, aead_off)) == SIZE_MAX) {
        /* retry with a new key, if possible */
        if (space->cipher.ingress.key_phase.decrypted == space->cipher.ingress.key_phase.prepared &&
            space->cipher.ingress.key_phase.decrypted % 2 != aead_index) {
            /* reapply AEAD to revert payload to the encrypted form. This assumes that the cipher used in AEAD is CTR. */
            aead_decrypt_core(aead, pn, packet, aead_off);
            goto Retry_1RTT;
        }
        /* otherwise return failure */
        return QUICLY_ERROR_PACKET_IGNORED;
    }

    /* update the confirmed key phase and also the egress key phase, if necessary */
    if (space->cipher.ingress.key_phase.prepared != space->cipher.ingress.key_phase.decrypted &&
        space->cipher.ingress.key_phase.prepared % 2 == aead_index) {
        if ((ret = received_key_update(conn, space->cipher.ingress.key_phase.prepared)) != 0)
            return ret;
    }

    return 0;
}